

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TType * __thiscall
glslang::HlslParseContext::getStructBufferContentType(HlslParseContext *this,TType *type)

{
  TType *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  TTypeList *pTVar3;
  TType *pTVar4;
  
  iVar2 = (*type->_vptr_TType[7])(type);
  if ((iVar2 == 0x10) &&
     (iVar2 = (*type->_vptr_TType[0xb])(type),
     (*(uint *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) == 6)) {
    pTVar3 = TType::getStruct(type);
    iVar2 = (int)((long)(pTVar3->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ).
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pTVar3->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ).
                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
    if (iVar2 < 1) {
      __assert_fail("memberCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0x1b5d,
                    "TType *glslang::HlslParseContext::getStructBufferContentType(const TType &) const"
                   );
    }
    pTVar3 = TType::getStruct(type);
    pTVar1 = (pTVar3->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar2 - 1].type;
    iVar2 = (*pTVar1->_vptr_TType[0x1f])(pTVar1);
    pTVar4 = (TType *)0x0;
    if ((char)iVar2 != '\0') {
      pTVar4 = pTVar1;
    }
  }
  else {
    pTVar4 = (TType *)0x0;
  }
  return pTVar4;
}

Assistant:

TType* HlslParseContext::getStructBufferContentType(const TType& type) const
{
    if (type.getBasicType() != EbtBlock || type.getQualifier().storage != EvqBuffer)
        return nullptr;

    const int memberCount = (int)type.getStruct()->size();
    assert(memberCount > 0);

    TType* contentType = (*type.getStruct())[memberCount-1].type;

    return contentType->isUnsizedArray() ? contentType : nullptr;
}